

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::SourceCodeInfo::SourceCodeInfo(SourceCodeInfo *this,Arena *arena)

{
  Arena *in_RSI;
  SourceCodeInfo *in_RDI;
  Arena *in_stack_ffffffffffffffb8;
  
  Message::Message(&in_RDI->super_Message);
  ((RepeatedPtrFieldBase *)&in_RDI->super_Message)->arena_ = (Arena *)&PTR__SourceCodeInfo_00964230;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            ((InternalMetadataWithArena *)in_RDI,in_stack_ffffffffffffffb8);
  memset(&in_RDI->_has_bits_,0,4);
  internal::CachedSize::CachedSize((CachedSize *)0x52f408);
  RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)in_RDI,
             (Arena *)&in_RDI->location_);
  SharedCtor((SourceCodeInfo *)0x52f42b);
  RegisterArenaDtor(in_RDI,in_RSI);
  return;
}

Assistant:

SourceCodeInfo::SourceCodeInfo(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
  _internal_metadata_(arena),
  location_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:google.protobuf.SourceCodeInfo)
}